

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

void Gia_IsoAssignOneClass3(Gia_IsoMan_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int *piVar4;
  word *pwVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar6 = p->vClasses->nSize;
  if (iVar6 < 1) {
    __assert_fail("Vec_IntSize(p->vClasses) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x22e,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
  }
  iVar6 = Vec_IntEntry(p->vClasses,iVar6 + -2);
  uVar7 = Vec_IntEntry(p->vClasses,p->vClasses->nSize + -1);
  Vec_IntShrink(p->vClasses,p->vClasses->nSize + -2);
  if ((int)uVar7 < 2) {
    __assert_fail("nSize > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x234,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
  }
  piVar4 = p->pUniques;
  pwVar5 = p->pStoreW;
  uVar8 = pwVar5[iVar6] >> 0x20;
  if (uVar7 == 2) {
    if (piVar4[uVar8] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x237,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
    }
    iVar3 = p->nUniques;
    p->nUniques = iVar3 + 1;
    piVar4[uVar8] = iVar3;
    uVar1 = p->nSingles;
    uVar2 = p->nEntries;
    p->nSingles = uVar1 + 1;
    p->nEntries = uVar2 + -1;
    uVar9 = pwVar5[(long)iVar6 + 1] >> 0x20;
    if (piVar4[uVar9] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x23c,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
    }
    iVar6 = p->nUniques;
    p->nUniques = iVar6 + 1;
    piVar4[uVar9] = iVar6;
  }
  else {
    if (piVar4[uVar8] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x243,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
    }
    iVar6 = p->nUniques;
    p->nUniques = iVar6 + 1;
    piVar4[uVar8] = iVar6;
  }
  p->nSingles = p->nSingles + 1;
  p->nEntries = p->nEntries + -1;
  printf("Broke ties in last class of size %d at level %d.\n",(ulong)uVar7,
         (ulong)(uint)p->pLevels[uVar8]);
  return;
}

Assistant:

void Gia_IsoAssignOneClass3( Gia_IsoMan_t * p )
{
    int iBegin, nSize;
    // find the last class
    assert( Vec_IntSize(p->vClasses) > 0 );
    iBegin = Vec_IntEntry( p->vClasses, Vec_IntSize(p->vClasses) - 2 );
    nSize  = Vec_IntEntry( p->vClasses, Vec_IntSize(p->vClasses) - 1 );
    Vec_IntShrink( p->vClasses, Vec_IntSize(p->vClasses) - 2 );

    // assign the class
    assert( nSize > 1 );
    if ( nSize == 2 )
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;

        assert( p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin+1)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }
    else
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }
    printf( "Broke ties in last class of size %d at level %d.\n", nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
}